

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O2

bool ParseFilename(Value *val,string *result)

{
  bool bVar1;
  String local_40;
  
  bVar1 = Json::Value::isString(val);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_40,val);
    std::__cxx11::string::operator=((string *)result,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

static bool ParseFilename(Json::Value const& val, std::string& result)
{
  if (val.isString()) {
    result = val.asString();
  } else {
    return false;
  }

  return true;
}